

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O0

void av1_encode_dv(aom_writer *w,MV *mv,MV *ref,nmv_context *mvctx)

{
  MV_JOINT_TYPE type;
  int iVar1;
  aom_cdf_prob *in_RCX;
  short *in_RDX;
  aom_writer *in_RSI;
  MV_JOINT_TYPE j;
  MV diff;
  MvSubpelPrecision in_stack_0000002f;
  nmv_component *in_stack_00000030;
  int in_stack_0000003c;
  aom_writer *in_stack_00000040;
  MV nsymbs;
  
  nsymbs.col = *(short *)((long)&in_RSI->pos + 2) - in_RDX[1];
  nsymbs.row = (short)in_RSI->pos - *in_RDX;
  type = av1_get_mv_joint((MV *)&stack0xffffffffffffffdc);
  aom_write_symbol(in_RSI,(int)((ulong)in_RDX >> 0x20),in_RCX,(int)nsymbs);
  iVar1 = mv_joint_vertical(type);
  if (iVar1 != 0) {
    encode_mv_component(in_stack_00000040,in_stack_0000003c,in_stack_00000030,in_stack_0000002f);
  }
  iVar1 = mv_joint_horizontal(type);
  if (iVar1 != 0) {
    encode_mv_component(in_stack_00000040,in_stack_0000003c,in_stack_00000030,in_stack_0000002f);
  }
  return;
}

Assistant:

void av1_encode_dv(aom_writer *w, const MV *mv, const MV *ref,
                   nmv_context *mvctx) {
  // DV and ref DV should not have sub-pel.
  assert((mv->col & 7) == 0);
  assert((mv->row & 7) == 0);
  assert((ref->col & 7) == 0);
  assert((ref->row & 7) == 0);
  const MV diff = { mv->row - ref->row, mv->col - ref->col };
  const MV_JOINT_TYPE j = av1_get_mv_joint(&diff);

  aom_write_symbol(w, j, mvctx->joints_cdf, MV_JOINTS);
  if (mv_joint_vertical(j))
    encode_mv_component(w, diff.row, &mvctx->comps[0], MV_SUBPEL_NONE);

  if (mv_joint_horizontal(j))
    encode_mv_component(w, diff.col, &mvctx->comps[1], MV_SUBPEL_NONE);
}